

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_map_flow(Parser *this)

{
  char cVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  csubstr val;
  bool bVar13;
  undefined1 uVar14;
  int iVar15;
  State *pSVar16;
  uint uVar17;
  char *pcVar18;
  ulong ahead;
  ro_substr pattern;
  ro_substr chars;
  ro_substr pattern_00;
  ro_substr chars_00;
  ro_substr pattern_01;
  csubstr fmt;
  ro_substr chars_01;
  csubstr cVar19;
  size_t sStackY_230;
  basic_substring<const_char> local_1f8;
  bool is_quoted_1;
  char msg [35];
  csubstr trimmed;
  char *pcStack_178;
  size_t local_170;
  char *pcStack_150;
  size_t local_148;
  char *pcStack_128;
  size_t local_120;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_d8;
  size_t local_d0;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_88;
  size_t local_80;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  pSVar16 = this->m_state;
  local_1f8.str = (pSVar16->line_contents).rem.str;
  local_1f8.len = (pSVar16->line_contents).rem.len;
  if ((~pSVar16->flags & 0x14U) != 0) {
    builtin_strncpy(msg,"check failed: (has_all(RMAP|FLOW))",0x23);
    if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar3 = (code *)swi(3);
      uVar14 = (*pcVar3)();
      return (bool)uVar14;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar19 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_30 = cVar19.len;
    pcStack_38 = cVar19.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6f26) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6f26) << 0x40,8);
    LVar4.name.str = pcStack_38;
    LVar4.name.len = local_30;
    (*p_Var2)(msg,0x23,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  if (local_1f8.len == 0) {
    pSVar16 = this->m_state;
  }
  else {
    cVar1 = *local_1f8.str;
    if (cVar1 == '#') goto LAB_001c5158;
    if (cVar1 == ' ') {
      pSVar16 = this->m_state;
      if (((pSVar16->line_contents).rem.len == 0) || (*(pSVar16->line_contents).rem.str != ' ')) {
        builtin_strncpy(msg,"check failed: (m_state->line_conten",0x23);
        if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar3 = (code *)swi(3);
          uVar14 = (*pcVar3)();
          return (bool)uVar14;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        trimmed = (csubstr)(ZEXT816(0x6d66) << 0x40);
        cVar19 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_170 = cVar19.len;
        pcStack_178 = cVar19.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = (size_t)trimmed.str;
        LVar5.super_LineCol.line = trimmed.len;
        LVar5.name.str = pcStack_178;
        LVar5.name.len = local_170;
        (*p_Var2)(msg,0x3a,LVar5,(this->m_stack).m_callbacks.m_user_data);
        pSVar16 = this->m_state;
      }
      sStackY_230 = basic_substring<const_char>::first_not_of(&(pSVar16->line_contents).rem,' ',0);
      if (sStackY_230 == 0xffffffffffffffff) {
        sStackY_230 = (this->m_state->line_contents).rem.len;
      }
      goto LAB_001c4be3;
    }
    pSVar16 = this->m_state;
    if (cVar1 == '}') {
      if ((pSVar16->flags & 0x200) != 0) {
        _append_key_val_null(this,local_1f8.str + -1);
        this->m_state->flags = this->m_state->flags & 0xffffff7f;
      }
      _pop_level(this);
      _line_progressed(this,1);
      if ((this->m_state->flags & 0x2000) != 0) {
        _stop_seqimap(this);
        _pop_level(this);
        return true;
      }
      return true;
    }
  }
  uVar17 = pSVar16->flags;
  if ((uVar17 >> 8 & 1) == 0) {
    if ((uVar17 & 0x40) == 0) {
      if (-1 < (char)uVar17) {
        bVar13 = is_debugger_attached();
        if ((bVar13) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar3 = (code *)swi(3);
          uVar14 = (*pcVar3)();
          return (bool)uVar14;
        }
        pcVar18 = "ERROR: internal error";
        sStackY_230 = 0x15;
        goto LAB_001c4c09;
      }
      if ((uVar17 >> 9 & 1) == 0) {
        builtin_strncpy(msg,"check failed: (has_all(SSCL))",0x1e);
        if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
          pcVar3 = (code *)swi(3);
          uVar14 = (*pcVar3)();
          return (bool)uVar14;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar19 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_148 = cVar19.len;
        pcStack_150 = cVar19.str;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6fe5) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x6fe5) << 0x40,8);
        LVar11.name.str = pcStack_150;
        LVar11.name.len = local_148;
        (*p_Var2)(msg,0x1e,LVar11,(this->m_stack).m_callbacks.m_user_data);
      }
      bVar13 = _scan_scalar_map_flow(this,&local_1f8,(bool *)msg);
      if (bVar13) {
        this->m_state->flags = this->m_state->flags & 0xfffffe3fU | 0x100;
        val.len = local_1f8.len;
        val.str = local_1f8.str;
        _append_key_val(this,val,(uint)(byte)msg[0]);
      }
      else {
        if (local_1f8.len != 0) {
          if (*local_1f8.str == '{') {
            this->m_state->flags = this->m_state->flags & 0xfffffe3fU | 0x100;
            _push_level(this,true);
            _move_scalar_from_top(this);
            _start_map(this,true);
            pSVar16 = this->m_state;
            uVar17 = pSVar16->flags & 0xfffffe2fU | 0x50;
            goto LAB_001c4bdb;
          }
          if (*local_1f8.str == '[') {
            this->m_state->flags = this->m_state->flags & 0xfffffe3fU | 0x100;
            _push_level(this,true);
            _move_scalar_from_top(this);
            _start_seq(this,true);
            this->m_state->flags = this->m_state->flags | 0x10;
            goto LAB_001c4bdd;
          }
        }
        bVar13 = _handle_types(this);
        if (bVar13) {
          return true;
        }
        bVar13 = _handle_val_anchors_and_refs(this);
        if (bVar13) {
          return true;
        }
        if ((local_1f8.len == 0) || (*local_1f8.str != ',')) {
          uVar17 = this->m_state->flags;
          if (((uVar17 >> 0xd & 1) != 0 && local_1f8.len != 0) && (*local_1f8.str == ']')) {
            if ((uVar17 >> 9 & 1) != 0) {
              _append_key_val_null(this,local_1f8.str + -1);
            }
            goto LAB_001c4d1f;
          }
          bVar13 = is_debugger_attached();
          if ((bVar13) && (bVar13 = is_debugger_attached(), bVar13)) {
            pcVar3 = (code *)swi(3);
            uVar14 = (*pcVar3)();
            return (bool)uVar14;
          }
          goto LAB_001c4c00;
        }
        _append_key_val_null(this,local_1f8.str + -1);
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _line_progressed(this,1);
      }
      if ((this->m_state->flags & 0x2000) == 0) {
        return true;
      }
LAB_001c4d1f:
      _stop_seqimap(this);
      _pop_level(this);
      return true;
    }
    if ((char)uVar17 < '\0') {
      builtin_strncpy(msg,"check failed: (has_none(RVAL))",0x1f);
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar3 = (code *)swi(3);
        uVar14 = (*pcVar3)();
        return (bool)uVar14;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_d0 = cVar19.len;
      pcStack_d8 = cVar19.str;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6f6c) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x6f6c) << 0x40,8);
      LVar9.name.str = pcStack_d8;
      LVar9.name.len = local_d0;
      (*p_Var2)(msg,0x1f,LVar9,(this->m_stack).m_callbacks.m_user_data);
      uVar17 = this->m_state->flags;
    }
    if (((uVar17 >> 9 & 1) == 0) &&
       (bVar13 = _scan_scalar_map_flow(this,&local_1f8,&is_quoted_1), bVar13)) {
      cVar19.len = local_1f8.len;
      cVar19.str = local_1f8.str;
      _store_scalar(this,cVar19,(uint)is_quoted_1);
      local_1f8.str = (this->m_state->line_contents).rem.str;
      local_1f8.len = (this->m_state->line_contents).rem.len;
      chars.len = 2;
      chars.str = " \t";
      trimmed = basic_substring<const_char>::triml(&local_1f8,chars);
      if ((trimmed.len != 0) &&
         ((pattern_00.len = 2, pattern_00.str = ": ",
          bVar13 = basic_substring<const_char>::begins_with(&trimmed,pattern_00), bVar13 ||
          (chars_00.len = 3, chars_00.str = ":,}",
          bVar13 = basic_substring<const_char>::begins_with_any(&trimmed,chars_00), bVar13)))) {
        if (trimmed.str < local_1f8.str) {
          builtin_strncpy(msg,"check failed: (trimmed.str >= rem.s",0x23);
          if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
            pcVar3 = (code *)swi(3);
            uVar14 = (*pcVar3)();
            return (bool)uVar14;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar19 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_f8 = cVar19.len;
          pcStack_100 = cVar19.str;
          LVar10.super_LineCol.col = 0;
          LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6f77) << 0x40,0);
          LVar10.super_LineCol.line = SUB168(ZEXT816(0x6f77) << 0x40,8);
          LVar10.name.str = pcStack_100;
          LVar10.name.len = local_f8;
          (*p_Var2)(msg,0x27,LVar10,(this->m_stack).m_callbacks.m_user_data);
        }
        ahead = (long)trimmed.str - (long)local_1f8.str;
        if (local_1f8.len < ahead) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
            pcVar3 = (code *)swi(3);
            uVar14 = (*pcVar3)();
            return (bool)uVar14;
          }
          handle_error(0x1ea013,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,local_1f8.str + ahead,local_1f8.len - ahead);
        local_1f8.len = CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_));
        local_1f8.str = (char *)msg._0_8_;
        _line_progressed(this,ahead);
      }
    }
    pattern_01.len = 2;
    pattern_01.str = ": ";
    bVar13 = basic_substring<const_char>::begins_with(&local_1f8,pattern_01);
    if (bVar13) {
      this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
      sStackY_230 = 2;
      goto LAB_001c4e0d;
    }
    iVar15 = basic_substring<const_char>::compare(&local_1f8,':');
    if (iVar15 == 0) {
      this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
      sStackY_230 = 1;
      goto LAB_001c4e0d;
    }
    if (local_1f8.len != 0) {
      cVar1 = *local_1f8.str;
      if (cVar1 == ',') {
        _append_key_val_null(this,local_1f8.str + -1);
      }
      else if (cVar1 == '}') {
        if ((this->m_state->flags & 0x200) == 0) {
          builtin_strncpy(msg,"check failed: (has_all(SSCL))",0x1e);
          if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
            pcVar3 = (code *)swi(3);
            uVar14 = (*pcVar3)();
            return (bool)uVar14;
          }
          p_Var2 = (this->m_stack).m_callbacks.m_error;
          cVar19 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_120 = cVar19.len;
          pcStack_128 = cVar19.str;
          LVar12.super_LineCol.col = 0;
          LVar12.super_LineCol.offset = SUB168(ZEXT816(0x6fa8) << 0x40,0);
          LVar12.super_LineCol.line = SUB168(ZEXT816(0x6fa8) << 0x40,8);
          LVar12.name.str = pcStack_128;
          LVar12.name.len = local_120;
          (*p_Var2)(msg,0x1e,LVar12,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val_null(this,local_1f8.str + -1);
        uVar17 = this->m_state->flags;
        this->m_state->flags = uVar17 & 0xffffff7f;
        if ((uVar17 >> 0xd & 1) != 0) {
          _stop_seqimap(this);
          _pop_level(this);
        }
        _pop_level(this);
      }
      else {
        if (cVar1 != '?') goto LAB_001c4e35;
        this->m_state->flags = this->m_state->flags | 0x20;
      }
LAB_001c4bdd:
      sStackY_230 = 1;
LAB_001c4be3:
      _line_progressed(this,sStackY_230);
      return true;
    }
LAB_001c4e35:
    bVar13 = _handle_types(this);
    if (bVar13) {
      return true;
    }
    bVar13 = _handle_key_anchors_and_refs(this);
    if (bVar13) {
      return true;
    }
    iVar15 = basic_substring<const_char>::compare(&local_1f8,"",0);
    if (iVar15 == 0) {
      return true;
    }
    chars_01.len = 2;
    chars_01.str = " \t";
    sStackY_230 = basic_substring<const_char>::first_not_of(&local_1f8,chars_01,0);
    if (sStackY_230 == 0xffffffffffffffff) {
      sStackY_230 = 0;
    }
    if (local_1f8.len < sStackY_230) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar3 = (code *)swi(3);
        uVar14 = (*pcVar3)();
        return (bool)uVar14;
      }
      handle_error(0x1ea013,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,local_1f8.str + sStackY_230,
               local_1f8.len - sStackY_230);
    local_1f8.str = (char *)msg._0_8_;
    local_1f8.len = CONCAT17(msg[0xf],CONCAT16(msg[0xe],msg._8_6_));
    if (local_1f8.len != 0) {
      if (*(char *)msg._0_8_ == '#') {
        _line_progressed(this,sStackY_230);
LAB_001c5158:
        _scan_comment(this);
        return true;
      }
      if (*(char *)msg._0_8_ == ':') {
        this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
        sStackY_230 = sStackY_230 + 1;
LAB_001c4e0d:
        _line_progressed(this,sStackY_230);
        if ((this->m_state->flags & 0x200) != 0) {
          return true;
        }
        _store_scalar_null(this,local_1f8.str);
        return true;
      }
    }
    bVar13 = is_debugger_attached();
    if ((bVar13) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar3 = (code *)swi(3);
      uVar14 = (*pcVar3)();
      return (bool)uVar14;
    }
  }
  else {
    if ((uVar17 & 0x40) != 0) {
      builtin_strncpy(msg,"check failed: (has_none(RKEY))",0x1f);
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar3 = (code *)swi(3);
        uVar14 = (*pcVar3)();
        return (bool)uVar14;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_58 = cVar19.len;
      pcStack_60 = cVar19.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6f52) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6f52) << 0x40,8);
      LVar6.name.str = pcStack_60;
      LVar6.name.len = local_58;
      (*p_Var2)(msg,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
      uVar17 = this->m_state->flags;
    }
    if ((char)uVar17 < '\0') {
      builtin_strncpy(msg,"check failed: (has_none(RVAL))",0x1f);
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar3 = (code *)swi(3);
        uVar14 = (*pcVar3)();
        return (bool)uVar14;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_80 = cVar19.len;
      pcStack_88 = cVar19.str;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6f53) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x6f53) << 0x40,8);
      LVar7.name.str = pcStack_88;
      LVar7.name.len = local_80;
      (*p_Var2)(msg,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
      uVar17 = this->m_state->flags;
    }
    if ((uVar17 >> 0xd & 1) != 0) {
      builtin_strncpy(msg,"check failed: (has_none(RSEQIMAP))",0x23);
      if ((((byte)s_error_flags & 1) != 0) && (bVar13 = is_debugger_attached(), bVar13)) {
        pcVar3 = (code *)swi(3);
        uVar14 = (*pcVar3)();
        return (bool)uVar14;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_a8 = cVar19.len;
      pcStack_b0 = cVar19.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6f54) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x6f54) << 0x40,8);
      LVar8.name.str = pcStack_b0;
      LVar8.name.len = local_a8;
      (*p_Var2)(msg,0x23,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    pattern.len = 2;
    pattern.str = ", ";
    bVar13 = basic_substring<const_char>::begins_with(&local_1f8,pattern);
    if (bVar13) {
      this->m_state->flags = this->m_state->flags & 0xfffffebfU | 0x40;
      sStackY_230 = 2;
      goto LAB_001c4be3;
    }
    if ((local_1f8.len != 0) && (*local_1f8.str == ',')) {
      pSVar16 = this->m_state;
      uVar17 = pSVar16->flags & 0xfffffebfU | 0x40;
LAB_001c4bdb:
      pSVar16->flags = uVar17;
      goto LAB_001c4bdd;
    }
    bVar13 = is_debugger_attached();
    if ((bVar13) && (bVar13 = is_debugger_attached(), bVar13)) {
      pcVar3 = (code *)swi(3);
      uVar14 = (*pcVar3)();
      return (bool)uVar14;
    }
  }
LAB_001c4c00:
  pcVar18 = "ERROR: parse error";
  sStackY_230 = 0x12;
LAB_001c4c09:
  fmt.len = sStackY_230;
  fmt.str = pcVar18;
  _err<>(this,fmt);
  return false;
}

Assistant:

bool Parser::_handle_map_flow()
{
    // explicit flow, ie, inside {}, separated by commas
    _c4dbgpf("handle_map_flow: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with('}'))
    {
        _c4dbgp("end the map");
        if(has_all(SSCL))
        {
            _c4dbgp("the last val was null");
            _append_key_val_null(rem.str - 1);
            rem_flags(RVAL);
        }
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _c4dbgp("stopping implicitly nested 1x map");
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RSEQIMAP));

        if(rem.begins_with(", "))
        {
            _c4dbgp("seq: expect next keyval");
            addrem_flags(RKEY, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("seq: expect next keyval");
            addrem_flags(RKEY, RNXT);
            _line_progressed(1);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        bool is_quoted;
        if(has_none(SSCL) && _scan_scalar_map_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            _store_scalar(rem, is_quoted);
            rem = m_state->line_contents.rem;
            csubstr trimmed = rem.triml(" \t");
            if(trimmed.len && (trimmed.begins_with(": ") || trimmed.begins_with_any(":,}") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, trimmed.str >= rem.str);
                size_t num = static_cast<size_t>(trimmed.str - rem.str);
                _c4dbgpf("trimming {} whitespace after the scalar: '{}' --> '{}'", num, rem, rem.sub(num));
                rem = rem.sub(num);
                _line_progressed(num);
            }
        }

        if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("wait for val");
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(2);
            if(!has_all(SSCL))
            {
                _c4dbgp("no key was found, defaulting to empty key ''");
                _store_scalar_null(rem.str);
            }
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgp("wait for val");
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            if(!has_all(SSCL))
            {
                _c4dbgp("no key was found, defaulting to empty key ''");
                _store_scalar_null(rem.str);
            }
            return true;
        }
        else if(rem.begins_with('?'))
        {
            _c4dbgp("complex key");
            add_flags(QMRK);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("prev scalar was a key with null value");
            _append_key_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('}'))
        {
            _c4dbgp("map terminates after a key...");
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
            _c4dbgp("the last val was null");
            _append_key_val_null(rem.str - 1);
            rem_flags(RVAL);
            if(has_all(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            _pop_level();
            _line_progressed(1);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem == "")
        {
            return true;
        }
        else
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == csubstr::npos)
               pos = 0;
            rem = rem.sub(pos);
            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(pos + 1);
                if(!has_all(SSCL))
                {
                    _c4dbgp("no key was found, defaulting to empty key ''");
                    _store_scalar_null(rem.str);
                }
                return true;
            }
            else if(rem.begins_with('#'))
            {
                _c4dbgp("it's a comment");
                _line_progressed(pos);
                rem = _scan_comment(); // also progresses the line
                return true;
            }
            else
            {
                _c4err("parse error");
            }
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
        bool is_quoted;
        if(_scan_scalar_map_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL|RKEY);
            _append_key_val(rem, is_quoted);
            if(has_all(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL|RKEY); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL|RKEY); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RNXT|RVAL);
            _line_progressed(1);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("appending empty val");
            _append_key_val_null(rem.str - 1);
            addrem_flags(RKEY, RVAL);
            _line_progressed(1);
            if(has_any(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            return true;
        }
        else if(has_any(RSEQIMAP) && rem.begins_with(']'))
        {
            _c4dbgp("stopping implicitly nested 1x map");
            if(has_any(SSCL))
            {
                _append_key_val_null(rem.str - 1);
            }
            _stop_seqimap();
            _pop_level();
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}